

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::visitTryStatement(CodegenVisitor *this,TryStatement *tryStmt)

{
  long lVar1;
  size_type sVar2;
  long *plVar3;
  SQInteger SVar4;
  SQFuncState *this_00;
  SQInteger SVar5;
  SQFuncState *this_01;
  Id *this_02;
  SQInteger SVar6;
  TryStatement *in_RSI;
  long in_RDI;
  SQObject SVar7;
  SQInteger oldouters_1;
  SQInteger ex_target;
  SQScope __oldscope___1;
  SQInteger jmppos;
  SQInteger oldouters;
  SQScope __oldscope__;
  SQInteger trappos;
  SQObjectPtr *in_stack_ffffffffffffff10;
  CodegenVisitor *in_stack_ffffffffffffff18;
  CodegenVisitor *visitor;
  CodegenVisitor *in_stack_ffffffffffffff20;
  SQInteger in_stack_ffffffffffffff28;
  SQInteger arg3;
  SQInteger in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  SQOpcode SVar8;
  SQFuncState *in_stack_ffffffffffffff40;
  SQInteger in_stack_ffffffffffffff48;
  undefined1 *len;
  SQFuncState *this_03;
  SQFuncState *in_stack_ffffffffffffff80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  SQInteger local_58;
  long local_50;
  SQLocalVarInfo *local_28;
  SQAllocContext pSStack_20;
  SQInteger local_18;
  TryStatement *local_10;
  
  SVar8 = (SQOpcode)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_10 = in_RSI;
  addLineNumber(in_stack_ffffffffffffff20,(Statement *)in_stack_ffffffffffffff18);
  SQFuncState::AddInstruction
            (in_stack_ffffffffffffff40,SVar8,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (SQInteger)in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
  *(long *)(*(long *)(in_RDI + 8) + 0x1c8) = *(long *)(*(long *)(in_RDI + 8) + 0x1c8) + 1;
  sVar2 = sqvector<long,_unsigned_int>::size
                    ((sqvector<long,_unsigned_int> *)(*(long *)(in_RDI + 8) + 0x160));
  if (sVar2 != 0) {
    plVar3 = sqvector<long,_unsigned_int>::top
                       ((sqvector<long,_unsigned_int> *)(*(long *)(in_RDI + 8) + 0x160));
    *plVar3 = *plVar3 + 1;
  }
  sVar2 = sqvector<long,_unsigned_int>::size
                    ((sqvector<long,_unsigned_int> *)(*(long *)(in_RDI + 8) + 0x178));
  if (sVar2 != 0) {
    plVar3 = sqvector<long,_unsigned_int>::top
                       ((sqvector<long,_unsigned_int> *)(*(long *)(in_RDI + 8) + 0x178));
    *plVar3 = *plVar3 + 1;
  }
  local_18 = SQFuncState::GetCurrentPos((SQFuncState *)0x1c4798);
  local_28 = *(SQLocalVarInfo **)(in_RDI + 0x20);
  pSStack_20 = *(SQAllocContext *)(in_RDI + 0x28);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x1d0);
  SVar4 = SQFuncState::GetStackSize((SQFuncState *)0x1c47cc);
  *(SQInteger *)(in_RDI + 0x28) = SVar4;
  this_00 = (SQFuncState *)(in_RDI + 0x30);
  this_03 = (SQFuncState *)&stack0xffffffffffffffc8;
  ::SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff10);
  sqvector<SQObjectPtr,_unsigned_int>::push_back
            ((sqvector<SQObjectPtr,_unsigned_int> *)in_stack_ffffffffffffff20,
             (SQObjectPtr *)in_stack_ffffffffffffff18);
  ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff10);
  TryStatement::tryStatement(local_10);
  Node::visit<SQCompilation::CodegenVisitor>
            ((Node *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_50 = *(long *)(*(long *)(in_RDI + 8) + 0x1d0);
  SVar4 = SQFuncState::GetStackSize((SQFuncState *)0x1c484c);
  if ((SVar4 != *(long *)(in_RDI + 0x28)) &&
     (SQFuncState::SetStackSize(this_00,in_stack_ffffffffffffff48),
     local_50 != *(long *)(*(long *)(in_RDI + 8) + 0x1d0))) {
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffff40,SVar8,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (SQInteger)in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
  }
  *(SQLocalVarInfo **)(in_RDI + 0x20) = local_28;
  *(SQAllocContext *)(in_RDI + 0x28) = pSStack_20;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back((sqvector<SQObjectPtr,_unsigned_int> *)0x1c48f5);
  *(long *)(*(long *)(in_RDI + 8) + 0x1c8) = *(long *)(*(long *)(in_RDI + 8) + 0x1c8) + -1;
  SQFuncState::AddInstruction
            (in_stack_ffffffffffffff40,SVar8,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (SQInteger)in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
  sVar2 = sqvector<long,_unsigned_int>::size
                    ((sqvector<long,_unsigned_int> *)(*(long *)(in_RDI + 8) + 0x160));
  if (sVar2 != 0) {
    plVar3 = sqvector<long,_unsigned_int>::top
                       ((sqvector<long,_unsigned_int> *)(*(long *)(in_RDI + 8) + 0x160));
    *plVar3 = *plVar3 + -1;
  }
  sVar2 = sqvector<long,_unsigned_int>::size
                    ((sqvector<long,_unsigned_int> *)(*(long *)(in_RDI + 8) + 0x178));
  if (sVar2 != 0) {
    plVar3 = sqvector<long,_unsigned_int>::top
                       ((sqvector<long,_unsigned_int> *)(*(long *)(in_RDI + 8) + 0x178));
    *plVar3 = *plVar3 + -1;
  }
  SQFuncState::AddInstruction
            (in_stack_ffffffffffffff40,SVar8,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (SQInteger)in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
  local_58 = SQFuncState::GetCurrentPos((SQFuncState *)0x1c49cf);
  SVar4 = *(SQInteger *)(in_RDI + 8);
  SVar6 = local_18;
  SQFuncState::GetCurrentPos((SQFuncState *)0x1c49fa);
  SQFuncState::SetInstructionParam(in_stack_ffffffffffffff40,SVar6,SVar4,in_stack_ffffffffffffff28);
  local_68 = *(undefined8 *)(in_RDI + 0x20);
  uStack_60 = *(undefined8 *)(in_RDI + 0x28);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x1d0);
  SVar5 = SQFuncState::GetStackSize((SQFuncState *)0x1c4a45);
  *(SQInteger *)(in_RDI + 0x28) = SVar5;
  this_01 = (SQFuncState *)(in_RDI + 0x30);
  len = local_78;
  ::SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff10);
  sqvector<SQObjectPtr,_unsigned_int>::push_back
            ((sqvector<SQObjectPtr,_unsigned_int> *)in_stack_ffffffffffffff20,
             (SQObjectPtr *)in_stack_ffffffffffffff18);
  ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff10);
  visitor = *(CodegenVisitor **)(in_RDI + 8);
  this_02 = TryStatement::exceptionId(local_10);
  Id::id(this_02);
  SVar7 = SQFuncState::CreateString(this_03,(SQChar *)this_00,(SQInteger)len);
  SQFuncState::PushLocalVariable
            (in_stack_ffffffffffffff80,(SQObject *)SVar7._unVal.pTable,SVar7._7_1_);
  SQFuncState::SetInstructionParam(this_01,SVar6,SVar4,in_stack_ffffffffffffff28);
  TryStatement::catchStatement(local_10);
  Node::visit<SQCompilation::CodegenVisitor>((Node *)in_stack_ffffffffffffff20,visitor);
  SVar5 = *(SQInteger *)(in_RDI + 8);
  arg3 = local_58;
  SQFuncState::GetCurrentPos((SQFuncState *)0x1c4b4a);
  SQFuncState::SetInstructionParams(this_00,(SQInteger)len,(SQInteger)this_01,SVar6,SVar4,arg3);
  SVar8 = (SQOpcode)((ulong)SVar6 >> 0x20);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x1d0);
  SVar6 = SQFuncState::GetStackSize((SQFuncState *)0x1c4b8d);
  if ((SVar6 != *(long *)(in_RDI + 0x28)) &&
     (SQFuncState::SetStackSize(this_00,(SQInteger)len),
     lVar1 != *(long *)(*(long *)(in_RDI + 8) + 0x1d0))) {
    SQFuncState::AddInstruction(this_01,SVar8,SVar4,arg3,SVar5,(SQInteger)visitor);
  }
  *(undefined8 *)(in_RDI + 0x20) = local_68;
  *(undefined8 *)(in_RDI + 0x28) = uStack_60;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back((sqvector<SQObjectPtr,_unsigned_int> *)0x1c4c30);
  return;
}

Assistant:

void CodegenVisitor::visitTryStatement(TryStatement *tryStmt) {
    addLineNumber(tryStmt);
    _fs->AddInstruction(_OP_PUSHTRAP, 0, 0);
    _fs->_traps++;

    if (_fs->_breaktargets.size()) _fs->_breaktargets.top()++;
    if (_fs->_continuetargets.size()) _fs->_continuetargets.top()++;

    SQInteger trappos = _fs->GetCurrentPos();
    {
        BEGIN_SCOPE();
        tryStmt->tryStatement()->visit(this);
        END_SCOPE();
    }

    _fs->_traps--;
    _fs->AddInstruction(_OP_POPTRAP, 1, 0);
    if (_fs->_breaktargets.size()) _fs->_breaktargets.top()--;
    if (_fs->_continuetargets.size()) _fs->_continuetargets.top()--;
    _fs->AddInstruction(_OP_JMP, 0, 0);
    SQInteger jmppos = _fs->GetCurrentPos();
    _fs->SetInstructionParam(trappos, 1, (_fs->GetCurrentPos() - trappos));

    {
        BEGIN_SCOPE();
        SQInteger ex_target = _fs->PushLocalVariable(_fs->CreateString(tryStmt->exceptionId()->id()), false);
        _fs->SetInstructionParam(trappos, 0, ex_target);
        tryStmt->catchStatement()->visit(this);
        _fs->SetInstructionParams(jmppos, 0, (_fs->GetCurrentPos() - jmppos), 0);
        END_SCOPE();
    }
}